

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCacheFreeObjectList(xmlPointerListPtr list)

{
  void *pvVar1;
  xmlXPathObjectPtr obj;
  int i;
  xmlPointerListPtr list_local;
  
  if (list != (xmlPointerListPtr)0x0) {
    for (obj._4_4_ = 0; obj._4_4_ < list->number; obj._4_4_ = obj._4_4_ + 1) {
      pvVar1 = list->items[obj._4_4_];
      if (*(long *)((long)pvVar1 + 8) != 0) {
        if (*(long *)(*(long *)((long)pvVar1 + 8) + 8) != 0) {
          (*xmlFree)(*(void **)(*(long *)((long)pvVar1 + 8) + 8));
        }
        (*xmlFree)(*(void **)((long)pvVar1 + 8));
      }
      (*xmlFree)(pvVar1);
    }
    xmlPointerListFree(list);
  }
  return;
}

Assistant:

static void
xmlXPathCacheFreeObjectList(xmlPointerListPtr list)
{
    int i;
    xmlXPathObjectPtr obj;

    if (list == NULL)
	return;

    for (i = 0; i < list->number; i++) {
	obj = list->items[i];
	/*
	* Note that it is already assured that we don't need to
	* look out for namespace nodes in the node-set.
	*/
	if (obj->nodesetval != NULL) {
	    if (obj->nodesetval->nodeTab != NULL)
		xmlFree(obj->nodesetval->nodeTab);
	    xmlFree(obj->nodesetval);
	}
	xmlFree(obj);
#ifdef XP_DEBUG_OBJ_USAGE
	xmlXPathDebugObjCounterAll--;
#endif
    }
    xmlPointerListFree(list);
}